

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::AbstractDOMParser::startElement
          (AbstractDOMParser *this,XMLElementDecl *elemDecl,uint urlId,XMLCh *elemPrefix,
          RefVectorOf<xercesc_4_0::XMLAttr> *attrList,XMLSize_t attrCount,bool isEmpty,bool isRoot)

{
  XMLBufferMgr *pXVar1;
  bool bVar2;
  XMLCh XVar3;
  XMLCh XVar4;
  uint uVar5;
  XMLScanner *this_00;
  QName *pQVar6;
  DOMDocumentImpl *pDVar7;
  DOMNode *pDVar8;
  int iVar9;
  uint uVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _func_int **pp_Var11;
  undefined4 extraout_var_01;
  XMLAttr *this_01;
  XMLCh *pXVar12;
  DOMNode *pDVar13;
  XMLCh *pXVar14;
  undefined4 extraout_var_03;
  DOMNodeIDMap *this_02;
  undefined4 extraout_var_05;
  long lVar15;
  long *plVar16;
  XMLCh *pXVar17;
  XMLBuffer *pXVar18;
  undefined8 uVar19;
  long *plVar20;
  long *plVar21;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  ulong uVar22;
  long *plVar23;
  undefined8 *puVar24;
  DOMException *this_03;
  XMLCh *pXVar25;
  DOMDocument *doc;
  XMLSize_t index;
  XMLSize_t XVar26;
  ulong uVar27;
  uint uriId;
  pointer_____offset_0x10___ *ppuVar28;
  DOMAttrMapImpl *this_04;
  int colonPos;
  XMLBufBid elemQName;
  DOMNode *local_88;
  int local_5c;
  XMLBuffer *local_58;
  XMLBufferMgr *local_50;
  XMLCh *local_48;
  DOMAttrMapImpl *local_40;
  BaseRefVectorOf<xercesc_4_0::XMLAttr> *local_38;
  undefined4 extraout_var_02;
  undefined4 extraout_var_04;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  
  this_00 = this->fScanner;
  bVar2 = this_00->fDoNamespaces;
  local_48 = elemPrefix;
  local_38 = &attrList->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>;
  if (bVar2 == true) {
    pXVar17 = elemDecl->fElementName->fLocalPart;
    if (this_00->fEmptyNamespaceId == urlId) {
      pp_Var11 = (this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler;
      pXVar25 = (XMLCh *)0x0;
    }
    else {
      pXVar25 = XMLScanner::getURIText(this_00,urlId);
      if ((elemPrefix != (XMLCh *)0x0) && (*elemPrefix != L'\0')) {
        pXVar1 = &this->fBufMgr;
        pXVar18 = XMLBufferMgr::bidOnBuffer(pXVar1);
        pXVar18->fIndex = 0;
        local_58 = pXVar18;
        local_50 = pXVar1;
        XMLBuffer::append(pXVar18,elemPrefix);
        XVar26 = pXVar18->fIndex;
        if (XVar26 == pXVar18->fCapacity) {
          XMLBuffer::ensureCapacity(pXVar18,1);
          XVar26 = pXVar18->fIndex;
        }
        pXVar18->fIndex = XVar26 + 1;
        pXVar18->fBuffer[XVar26] = L':';
        XMLBuffer::append(pXVar18,pXVar17);
        pXVar18->fBuffer[pXVar18->fIndex] = L'\0';
        iVar9 = (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x25])
                          (this,pXVar25,elemPrefix);
        local_88 = (DOMNode *)CONCAT44(extraout_var_00,iVar9);
        XMLBufferMgr::releaseBuffer(pXVar1,pXVar18);
        goto LAB_002d6899;
      }
      pp_Var11 = (this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler;
    }
    iVar9 = (*pp_Var11[0x25])(this,pXVar25,0,pXVar17,pXVar17);
    local_88 = (DOMNode *)CONCAT44(extraout_var_01,iVar9);
  }
  else {
    pXVar17 = QName::getRawName(elemDecl->fElementName);
    iVar9 = (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x24])(this,pXVar17);
    local_88 = (DOMNode *)CONCAT44(extraout_var,iVar9);
  }
LAB_002d6899:
  if (attrCount != 0) {
    uVar10 = this->fScanner->fEmptyNamespaceId;
    uVar5 = this->fScanner->fXMLNSNamespaceId;
    this_04 = (DOMAttrMapImpl *)local_88[0xf]._vptr_DOMNode;
    DOMAttrMapImpl::reserve(this_04,attrCount);
    XVar26 = 0;
    local_40 = this_04;
    do {
      this_01 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt(local_38,XVar26);
      pQVar6 = this_01->fAttName;
      if (bVar2 == false) {
        iVar9 = (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x26])
                          (this,pQVar6->fLocalPart);
        pDVar13 = (DOMNode *)CONCAT44(extraout_var_02,iVar9);
        DOMAttrMapImpl::setNamedItemFast(this_04,pDVar13);
      }
      else {
        uriId = pQVar6->fURIId;
        pXVar17 = pQVar6->fLocalPart;
        pXVar25 = pQVar6->fPrefix;
        if ((pXVar25 == (XMLCh *)0x0) || (*pXVar25 == L'\0')) {
          if (pXVar17 == L"xmlns") {
LAB_002d6975:
            uriId = uVar5;
          }
          else {
            pXVar12 = L"xmlns";
            if (pXVar17 == (XMLCh *)0x0) {
LAB_002d696f:
              if (*pXVar12 == L'\0') goto LAB_002d6975;
            }
            else {
              pXVar12 = L"xmlns";
              pXVar14 = pXVar17;
              do {
                XVar3 = *pXVar14;
                if (XVar3 == L'\0') goto LAB_002d696f;
                pXVar14 = pXVar14 + 1;
                XVar4 = *pXVar12;
                pXVar12 = pXVar12 + 1;
              } while (XVar3 == XVar4);
            }
          }
        }
        if (uriId == uVar10) {
          pXVar12 = (XMLCh *)0x0;
        }
        else {
          pXVar12 = XMLScanner::getURIText(this->fScanner,uriId);
        }
        pXVar14 = XMLAttr::getQName(this_01);
        iVar9 = (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x27])
                          (this,pXVar12,pXVar25,pXVar17,pXVar14);
        this_04 = local_40;
        pDVar13 = (DOMNode *)CONCAT44(extraout_var_03,iVar9);
        DOMAttrMapImpl::setNamedItemNSFast(local_40,pDVar13);
      }
      (*pDVar13->_vptr_DOMNode[0x38])(pDVar13,this_01->fValue);
      if (this_01->fType == ID) {
        pDVar7 = this->fDocument;
        this_02 = pDVar7->fNodeIDMap;
        if (this_02 == (DOMNodeIDMap *)0x0) {
          iVar9 = (*(pDVar7->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])(pDVar7,0x30);
          this_02 = (DOMNodeIDMap *)CONCAT44(extraout_var_04,iVar9);
          doc = &this->fDocument->super_DOMDocument;
          if (this->fDocument == (DOMDocumentImpl *)0x0) {
            doc = (DOMDocument *)0x0;
          }
          DOMNodeIDMap::DOMNodeIDMap(this_02,500,doc);
          this->fDocument->fNodeIDMap = this_02;
        }
        DOMNodeIDMap::add(this_02,(DOMAttr *)pDVar13);
        *(ushort *)&pDVar13[5]._vptr_DOMNode = *(ushort *)&pDVar13[5]._vptr_DOMNode | 0x100;
      }
      (*pDVar13->_vptr_DOMNode[0x33])(pDVar13,(ulong)this_01->fSpecified);
      if (this->fCreateSchemaInfo == true) {
        ppuVar28 = &DOMTypeInfoImpl::g_DtdNotValidatedAttribute;
        if ((ulong)(uint)this_01->fType < 10) {
          ppuVar28 = (pointer_____offset_0x10___ *)
                     (&PTR_g_DtdValidatedCDATAAttribute_0040a4c0)[(uint)this_01->fType];
        }
        (*pDVar13->_vptr_DOMNode[0x35])(pDVar13,ppuVar28);
      }
      XVar26 = XVar26 + 1;
    } while (XVar26 != attrCount);
  }
  iVar9 = (*(elemDecl->super_XSerializable)._vptr_XSerializable[7])();
  if ((char)iVar9 != '\0') {
    iVar9 = (*(elemDecl->super_XSerializable)._vptr_XSerializable[5])();
    plVar23 = (long *)CONCAT44(extraout_var_05,iVar9);
    lVar15 = (**(code **)(*plVar23 + 0x50))(plVar23);
    if (lVar15 != 0) {
      pXVar1 = &this->fBufMgr;
      uVar27 = 0;
      do {
        plVar16 = (long *)(**(code **)(*plVar23 + 0x58))(plVar23,uVar27);
        if (*(uint *)(plVar16 + 1) < 2) {
          if (bVar2 == false) {
            pDVar7 = this->fDocument;
            uVar19 = (**(code **)(*plVar16 + 0x28))(plVar16);
            iVar9 = (*(pDVar7->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x32])(pDVar7,uVar19);
            plVar20 = (long *)CONCAT44(extraout_var_06,iVar9);
            iVar9 = (*local_88->_vptr_DOMNode[0x48])(local_88,plVar20);
            plVar21 = (long *)CONCAT44(extraout_var_07,iVar9);
            if (plVar21 != (long *)0x0) {
              (**(code **)(*plVar21 + 0x138))(plVar21);
            }
          }
          else {
            pXVar17 = (XMLCh *)(**(code **)(*plVar16 + 0x28))(plVar16);
            pXVar18 = XMLBufferMgr::bidOnBuffer(pXVar1);
            local_5c = -1;
            local_58 = pXVar18;
            local_50 = pXVar1;
            uVar10 = XMLScanner::resolveQName
                               (this->fScanner,pXVar17,pXVar18,Mode_Attribute,&local_5c);
            if (pXVar17 == L"xmlns") {
LAB_002d6bad:
              uVar10 = this->fScanner->fXMLNSNamespaceId;
            }
            else {
              pXVar25 = L"xmlns";
              if (pXVar17 == (XMLCh *)0x0) {
LAB_002d6ba7:
                if (*pXVar25 == L'\0') goto LAB_002d6bad;
              }
              else {
                pXVar25 = L"xmlns";
                pXVar12 = pXVar17;
                do {
                  XVar3 = *pXVar12;
                  if (XVar3 == L'\0') goto LAB_002d6ba7;
                  pXVar12 = pXVar12 + 1;
                  XVar4 = *pXVar25;
                  pXVar25 = pXVar25 + 1;
                } while (XVar3 == XVar4);
              }
            }
            if (uVar10 == this->fScanner->fEmptyNamespaceId) {
              pXVar25 = (XMLCh *)0x0;
            }
            else {
              pXVar25 = XMLScanner::getURIText(this->fScanner,uVar10);
            }
            iVar9 = (*(this->fDocument->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x53])
                              (this->fDocument,pXVar25,pXVar17);
            plVar20 = (long *)CONCAT44(extraout_var_08,iVar9);
            iVar9 = (*local_88->_vptr_DOMNode[0x49])(local_88,plVar20);
            plVar21 = (long *)CONCAT44(extraout_var_09,iVar9);
            if (plVar21 != (long *)0x0) {
              (**(code **)(*plVar21 + 0x138))(plVar21);
            }
            XMLBufferMgr::releaseBuffer(pXVar1,pXVar18);
          }
          if (plVar16[4] != 0) {
            (**(code **)(*plVar20 + 0x1c0))(plVar20);
            (**(code **)(*plVar20 + 0x198))(plVar20,0);
          }
          if (this->fCreateSchemaInfo == true) {
            ppuVar28 = &DOMTypeInfoImpl::g_DtdNotValidatedAttribute;
            if ((ulong)*(uint *)((long)plVar16 + 0xc) < 10) {
              ppuVar28 = (pointer_____offset_0x10___ *)
                         (&PTR_g_DtdValidatedCDATAAttribute_0040a4c0)
                         [*(uint *)((long)plVar16 + 0xc)];
            }
            (**(code **)(*plVar20 + 0x1a8))(plVar20,ppuVar28);
          }
        }
        (**(code **)(*plVar16 + 0x30))(plVar16);
        uVar27 = uVar27 + 1;
        uVar22 = (**(code **)(*plVar23 + 0x50))(plVar23);
      } while (uVar27 < uVar22);
    }
  }
  pXVar17 = local_48;
  pDVar8 = this->fCurrentParent;
  pDVar13 = &(this->fDocument->super_DOMDocument).super_DOMNode;
  if (this->fDocument == (DOMDocumentImpl *)0x0) {
    pDVar13 = (DOMNode *)0x0;
  }
  if (pDVar8 == pDVar13) {
    (*pDVar8->_vptr_DOMNode[0x11])(pDVar8,local_88);
  }
  else {
    if (((pDVar8 == (DOMNode *)0x0) ||
        (plVar23 = (long *)__dynamic_cast(pDVar8,&DOMNode::typeinfo,&HasDOMParentImpl::typeinfo,
                                          0xfffffffffffffffe), plVar23 == (long *)0x0)) ||
       (lVar15 = (**(code **)(*plVar23 + 0x10))(plVar23), lVar15 == 0)) {
      this_03 = (DOMException *)__cxa_allocate_exception(0x28);
      DOMException::DOMException(this_03,0xb,0,XMLPlatformUtils::fgMemoryManager);
      __cxa_throw(this_03,&DOMException::typeinfo,DOMException::~DOMException);
    }
    puVar24 = (undefined8 *)(**(code **)(*plVar23 + 0x10))(plVar23);
    (**(code **)*puVar24)(puVar24,local_88);
  }
  this->fCurrentParent = local_88;
  this->fCurrentNode = local_88;
  this->fWithinElement = true;
  if (isEmpty) {
    (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[6])
              (this,elemDecl,(ulong)urlId,(ulong)isRoot,pXVar17);
  }
  return;
}

Assistant:

void AbstractDOMParser::startElement(const XMLElementDecl&   elemDecl
                             , const unsigned int            urlId
                             , const XMLCh* const            elemPrefix
                             , const RefVectorOf<XMLAttr>&   attrList
                             , const XMLSize_t               attrCount
                             , const bool                    isEmpty
                             , const bool                    isRoot)
{
    DOMElement     *elem;
    DOMElementImpl *elemImpl;
    const XMLCh* namespaceURI = 0;
    bool doNamespaces = fScanner->getDoNamespaces();

    // Create the element name. Here we are going to bypass the
    // DOMDocument::createElement() interface and instantiate the
    // required types directly in order to avoid name checking
    // overhead.
    //
    if (doNamespaces)
    {
        //DOM Level 2, doNamespaces on
        //
        const XMLCh* localName = elemDecl.getBaseName();

        if (urlId != fScanner->getEmptyNamespaceId()) {  //TagName has a prefix

            namespaceURI = fScanner->getURIText(urlId); //get namespaceURI

            if (elemPrefix && *elemPrefix)
            {
                XMLBufBid elemQName(&fBufMgr);

                elemQName.set(elemPrefix);
                elemQName.append(chColon);
                elemQName.append(localName);

                elem = createElementNS (
                  namespaceURI, elemPrefix, localName, elemQName.getRawBuffer());
            }
            else
              elem = createElementNS (namespaceURI, 0, localName, localName);
        }
        else
          elem = createElementNS (namespaceURI, 0, localName, localName);
    }
    else
    {   //DOM Level 1
        elem = createElement (elemDecl.getFullName());
    }

    elemImpl = (DOMElementImpl *) elem;

    if (attrCount)
    {
      unsigned int xmlnsNSId = fScanner->getXMLNSNamespaceId();
      unsigned int emptyNSId = fScanner->getEmptyNamespaceId();

      DOMAttrMapImpl* map = elemImpl->fAttributes;
      map->reserve (attrCount);

      for (XMLSize_t index = 0; index < attrCount; ++index)
      {
        const XMLAttr* oneAttrib = attrList.elementAt(index);
        DOMAttrImpl *attr = 0;

        if (doNamespaces)
        {
            //DOM Level 2, doNamespaces on
            //
            unsigned int attrURIId = oneAttrib->getURIId();
            const XMLCh* localName = oneAttrib->getName();
            const XMLCh* prefix = oneAttrib->getPrefix();
            namespaceURI = 0;

            if ((prefix==0 || *prefix==0) && XMLString::equals(localName, XMLUni::fgXMLNSString))
            {
                // xmlns=...
                attrURIId = xmlnsNSId;
            }
            if (attrURIId != emptyNSId)
            {
                //TagName has a prefix
                namespaceURI = fScanner->getURIText(attrURIId);
            }

            attr = (DOMAttrImpl*) createAttrNS (namespaceURI,
                                                prefix,
                                                localName,
                                                oneAttrib->getQName());

            map->setNamedItemNSFast(attr);
        }
        else
        {
            attr = (DOMAttrImpl*) createAttr (oneAttrib->getName());
            map->setNamedItemFast(attr);
        }

        attr->setValueFast(oneAttrib->getValue());

        // Attributes of type ID.  If this is one, add it to the hashtable of IDs
        //   that is constructed for use by GetElementByID().
        //
        if (oneAttrib->getType()==XMLAttDef::ID)
        {
            if (fDocument->fNodeIDMap == 0)
                fDocument->fNodeIDMap = new (fDocument) DOMNodeIDMap(500, fDocument);
            fDocument->fNodeIDMap->add(attr);
            attr->fNode.isIdAttr(true);
        }

        attr->setSpecified(oneAttrib->getSpecified());

        // store DTD validation information
        if(fCreateSchemaInfo)
        {
            switch(oneAttrib->getType())
            {
            case XMLAttDef::CData:          attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedCDATAAttribute); break;
            case XMLAttDef::ID:             attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedIDAttribute); break;
            case XMLAttDef::IDRef:          attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedIDREFAttribute); break;
            case XMLAttDef::IDRefs:         attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedIDREFSAttribute); break;
            case XMLAttDef::Entity:         attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedENTITYAttribute); break;
            case XMLAttDef::Entities:       attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedENTITIESAttribute); break;
            case XMLAttDef::NmToken:        attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedNMTOKENAttribute); break;
            case XMLAttDef::NmTokens:       attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedNMTOKENSAttribute); break;
            case XMLAttDef::Notation:       attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedNOTATIONAttribute); break;
            case XMLAttDef::Enumeration:    attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedENUMERATIONAttribute); break;
            default:                        attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdNotValidatedAttribute); break;
            }
        }
      }
    }

    //Set up the default attributes if any.
    //
    if (elemDecl.hasAttDefs())
    {
        XMLAttDefList* defAttrs = &elemDecl.getAttDefList();
        XMLAttDef* attr = 0;
        DOMAttrImpl * insertAttr = 0;

        for(XMLSize_t i=0; i<defAttrs->getAttDefCount(); i++)
        {
            attr = &defAttrs->getAttDef(i);

            const XMLAttDef::DefAttTypes defType = attr->getDefaultType();
            if ((defType == XMLAttDef::Default)
            ||  (defType == XMLAttDef::Fixed))
            {

                if (doNamespaces)
                {
                    // DOM Level 2 wants all namespace declaration attributes
                    // to be bound to "http://www.w3.org/2000/xmlns/"
                    // So as long as the XML parser doesn't do it, it needs to
                    // be done here.
                    const XMLCh* qualifiedName = attr->getFullName();
                    XMLBufBid bbPrefixQName(&fBufMgr);
                    XMLBuffer& prefixBuf = bbPrefixQName.getBuffer();
                    int colonPos = -1;
                    unsigned int uriId = fScanner->resolveQName(qualifiedName, prefixBuf, ElemStack::Mode_Attribute, colonPos);

                    const XMLCh* namespaceURI = 0;
                    if (XMLString::equals(qualifiedName, XMLUni::fgXMLNSString))    //for xmlns=...
                        uriId = fScanner->getXMLNSNamespaceId();
                    if (uriId != fScanner->getEmptyNamespaceId()) {  //TagName has a prefix
                        namespaceURI = fScanner->getURIText(uriId);
                    }

                    insertAttr = (DOMAttrImpl *) fDocument->createAttributeNS(namespaceURI,     // NameSpaceURI
                                                                              qualifiedName);   // qualified name

                    DOMAttr* remAttr = elemImpl->setDefaultAttributeNodeNS(insertAttr);
                    if (remAttr)
                        remAttr->release();
                }
                else
                {
                    // Namespaces is turned off...
                    insertAttr = (DOMAttrImpl *) fDocument->createAttribute(attr->getFullName());

                    DOMNode* remAttr = elemImpl->setDefaultAttributeNode(insertAttr);
                    if (remAttr)
                        remAttr->release();
                }
                //need to do this before the get as otherwise we overwrite any value in the attr
                if (attr->getValue() != 0)
                {
                    insertAttr->setValueFast(attr->getValue());
                    insertAttr->setSpecified(false);
                }

                // store DTD validation information
                if(fCreateSchemaInfo)
                {
                    switch(attr->getType())
                    {
                    case XMLAttDef::CData:          insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedCDATAAttribute); break;
                    case XMLAttDef::ID:             insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedIDAttribute); break;
                    case XMLAttDef::IDRef:          insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedIDREFAttribute); break;
                    case XMLAttDef::IDRefs:         insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedIDREFSAttribute); break;
                    case XMLAttDef::Entity:         insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedENTITYAttribute); break;
                    case XMLAttDef::Entities:       insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedENTITIESAttribute); break;
                    case XMLAttDef::NmToken:        insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedNMTOKENAttribute); break;
                    case XMLAttDef::NmTokens:       insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedNMTOKENSAttribute); break;
                    case XMLAttDef::Notation:       insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedNOTATIONAttribute); break;
                    case XMLAttDef::Enumeration:    insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedENUMERATIONAttribute); break;
                    default:                        insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdNotValidatedAttribute); break;
                    }
                }
            }

            insertAttr = 0;
            attr->reset();
        }
    }

    if (fCurrentParent != fDocument)
      castToParentImpl (fCurrentParent)->appendChildFast (elem);
    else
      fCurrentParent->appendChild (elem);

    fCurrentParent = elem;
    fCurrentNode = elem;
    fWithinElement = true;

    // If an empty element, do end right now (no endElement() will be called)
    if (isEmpty)
        endElement(elemDecl, urlId, isRoot, elemPrefix);
}